

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

ByteVector * __thiscall
ImgfsFile::DirEntry::getdatablock
          (ByteVector *__return_storage_ptr__,DirEntry *this,ImgfsFile *imgfs)

{
  ReadWriter_ptr local_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x30);
  *(undefined2 *)
   &(((ByteVectorWriter *)local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->super_MemoryReader).super_ReadWriter._readonly = 0x100;
  (((ByteVectorWriter *)local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->super_MemoryReader)._curpos = 0;
  (((ByteVectorWriter *)local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->super_MemoryReader).super_ReadWriter._vptr_ReadWriter = (_func_int **)&PTR__ReadWriter_00145f30;
  ((ByteVectorWriter *)local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _bv = __return_storage_ptr__;
  (((ByteVectorWriter *)local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->super_MemoryReader)._mem = (uint8_t *)0x0;
  (((ByteVectorWriter *)local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->super_MemoryReader)._size = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ByteVectorWriter*>
            (&local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ByteVectorWriter *)
             local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  savedirent(this,imgfs,&local_28);
  if (local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return __return_storage_ptr__;
}

Assistant:

ByteVector getdatablock(ImgfsFile& imgfs)
        {
            ByteVector filedata;
            savedirent(imgfs, ReadWriter_ptr(new ByteVectorWriter(filedata)));
            return filedata;
        }